

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

cmFileLockResult __thiscall
cmFileLockPool::LockFunctionScope(cmFileLockPool *this,string *filename,unsigned_long timeoutSec)

{
  bool bVar1;
  reference this_00;
  unsigned_long timeoutSec_local;
  string *filename_local;
  cmFileLockPool *this_local;
  
  bVar1 = IsAlreadyLocked(this,filename);
  if (bVar1) {
    this_local = (cmFileLockPool *)cmFileLockResult::MakeAlreadyLocked();
  }
  else {
    bVar1 = std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>::
            empty(&this->FunctionScopes);
    if (bVar1) {
      this_local = (cmFileLockPool *)cmFileLockResult::MakeNoFunction();
    }
    else {
      this_00 = std::vector<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>::
                back(&this->FunctionScopes);
      this_local = (cmFileLockPool *)ScopePool::Lock(this_00,filename,timeoutSec);
    }
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLockPool::LockFunctionScope(const std::string& filename,
                                                   unsigned long timeoutSec)
{
  if (this->IsAlreadyLocked(filename)) {
    return cmFileLockResult::MakeAlreadyLocked();
  }
  if (this->FunctionScopes.empty()) {
    return cmFileLockResult::MakeNoFunction();
  }
  return this->FunctionScopes.back().Lock(filename, timeoutSec);
}